

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall KDIS::NETWORK::Connection::~Connection(Connection *this)

{
  PDU_Factory *this_00;
  pointer pcVar1;
  pointer ppCVar2;
  int in_EDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int in_ESI;
  
  this->_vptr_Connection = (_func_int **)&PTR__Connection_00222bc0;
  shutdown(this,in_ESI,in_EDX);
  this_00 = this->m_pPduFact;
  if (this_00 != (PDU_Factory *)0x0) {
    UTILS::PDU_Factory::~PDU_Factory(this_00);
  }
  operator_delete(this_00,0x20);
  pcVar1 = (this->m_sLastIP)._M_dataplus._M_p;
  paVar3 = &(this->m_sLastIP).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  KDataStream::~KDataStream(&this->m_stream);
  ppCVar2 = (this->m_vpSubscribers).
            super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->m_vpSubscribers).
                                  super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
  }
  pcVar1 = (this->m_sSendAddress)._M_dataplus._M_p;
  paVar3 = &(this->m_sSendAddress).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Connection::~Connection()
{
    shutdown();
    delete m_pPduFact;
}